

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassConfidenceThresholdingValidator.cpp
# Opt level: O3

Result * CoreML::validate<(MLModelType)560>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  Type *pTVar6;
  undefined1 *puVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  int index;
  ModelDescription *interface;
  RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve> precisionrecallcurves;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  undefined1 local_90 [24];
  RepeatedPtrFieldBase local_78;
  pointer local_58;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  interface = format->description_;
  if (interface == (ModelDescription *)0x0) {
    interface = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  Result::Result((Result *)&local_58);
  local_78.arena_ = (Arena *)((ulong)local_78.arena_._4_4_ << 0x20);
  validateModelDescription
            ((Result *)local_a0,interface,format->specificationversion_,
             (ValidationPolicy *)&local_78);
  local_58 = (pointer)local_a0;
  std::__cxx11::string::operator=((string *)&local_50,(string *)&local_98);
  if (local_98._M_p != local_90 + 8) {
    operator_delete(local_98._M_p,local_90._8_8_ + 1);
  }
  bVar5 = Result::good((Result *)&local_58);
  if (bVar5) {
    if (format->_oneof_case_[0] == 0x230) {
      puVar7 = (undefined1 *)(format->Type_).pipeline_;
    }
    else {
      puVar7 = Specification::_ClassConfidenceThresholding_default_instance_;
    }
    local_78.arena_ = (Arena *)0x0;
    local_78.current_size_ = 0;
    local_78.total_size_ = 0;
    local_78.rep_ = (Rep *)0x0;
    google::protobuf::internal::RepeatedPtrFieldBase::
    MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
              (&local_78,&(((Pipeline *)puVar7)->models_).super_RepeatedPtrFieldBase);
    iVar4 = local_78.current_size_;
    if (local_78.current_size_ < 1) {
      local_a0 = (undefined1  [8])local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,
                 "The ClassConfidenceThresholding model has no precisionRecallCurves.","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a0);
LAB_002e60a1:
      if (local_a0 != (undefined1  [8])local_90) {
        operator_delete((void *)local_a0,local_90._0_8_ + 1);
      }
    }
    else {
      index = 0;
      do {
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&local_78,index);
        puVar7 = (undefined1 *)pTVar6->precisionvalues_;
        if ((FloatVector *)puVar7 == (FloatVector *)0x0) {
          puVar7 = Specification::_FloatVector_default_instance_;
        }
        iVar2 = (((FloatVector *)puVar7)->vector_).current_size_;
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&local_78,index);
        puVar7 = (undefined1 *)pTVar6->precisionconfidencethresholds_;
        if ((FloatVector *)puVar7 == (FloatVector *)0x0) {
          puVar7 = Specification::_FloatVector_default_instance_;
        }
        if ((iVar2 == 0) || (iVar2 != (((FloatVector *)puVar7)->vector_).current_size_)) {
          local_a0 = (undefined1  [8])local_90;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_a0,"Zero length or mismatched precisionRecallCurves components"
                     ,"");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a0);
          goto LAB_002e60a1;
        }
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&local_78,index);
        puVar7 = (undefined1 *)pTVar6->recallvalues_;
        if ((FloatVector *)puVar7 == (FloatVector *)0x0) {
          puVar7 = Specification::_FloatVector_default_instance_;
        }
        iVar2 = (((FloatVector *)puVar7)->vector_).current_size_;
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&local_78,index);
        puVar7 = (undefined1 *)pTVar6->recallconfidencethresholds_;
        if ((FloatVector *)puVar7 == (FloatVector *)0x0) {
          puVar7 = Specification::_FloatVector_default_instance_;
        }
        if ((iVar2 == 0) || (iVar2 != (((FloatVector *)puVar7)->vector_).current_size_)) {
          local_a0 = (undefined1  [8])local_90;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_a0,"Zero length or mismatched precisionRecallCurves components"
                     ,"");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a0);
          goto LAB_002e60a1;
        }
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&local_78,index);
        puVar7 = (undefined1 *)pTVar6->precisionvalues_;
        if ((FloatVector *)puVar7 == (FloatVector *)0x0) {
          puVar7 = Specification::_FloatVector_default_instance_;
        }
        lVar8 = (long)(((FloatVector *)puVar7)->vector_).current_size_;
        if (lVar8 != 0) {
          lVar9 = 0;
          do {
            uVar3 = *(uint *)((long)(((FloatVector *)puVar7)->vector_).arena_or_elements_ + lVar9);
            uVar10 = uVar3 & 0x7fffffff;
            if ((0x7f7fffff < uVar10 || uVar10 - 1 < 0x7fffff && (int)uVar3 < 0) ||
                uVar10 - 0x800000 < 0x7f000000 && (int)uVar3 < 0) {
              local_a0 = (undefined1  [8])local_90;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_a0,
                         "An element of precisionvalues is not a positive number or zero.","");
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a0);
              goto LAB_002e60a1;
            }
            lVar9 = lVar9 + 4;
          } while (lVar8 * 4 != lVar9);
        }
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&local_78,index);
        puVar7 = (undefined1 *)pTVar6->precisionconfidencethresholds_;
        if ((FloatVector *)puVar7 == (FloatVector *)0x0) {
          puVar7 = Specification::_FloatVector_default_instance_;
        }
        lVar8 = (long)(((FloatVector *)puVar7)->vector_).current_size_;
        if (lVar8 != 0) {
          lVar9 = 0;
          do {
            uVar3 = *(uint *)((long)(((FloatVector *)puVar7)->vector_).arena_or_elements_ + lVar9);
            uVar10 = uVar3 & 0x7fffffff;
            if ((0x7f7fffff < uVar10 || uVar10 - 1 < 0x7fffff && (int)uVar3 < 0) ||
                uVar10 - 0x800000 < 0x7f000000 && (int)uVar3 < 0) {
              local_a0 = (undefined1  [8])local_90;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_a0,
                         "An element of precisionconfidencethresholds is not a positive number or zero."
                         ,"");
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a0);
              goto LAB_002e60a1;
            }
            lVar9 = lVar9 + 4;
          } while (lVar8 * 4 != lVar9);
        }
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&local_78,index);
        puVar7 = (undefined1 *)pTVar6->recallvalues_;
        if ((FloatVector *)puVar7 == (FloatVector *)0x0) {
          puVar7 = Specification::_FloatVector_default_instance_;
        }
        lVar8 = (long)(((FloatVector *)puVar7)->vector_).current_size_;
        if (lVar8 != 0) {
          lVar9 = 0;
          do {
            uVar3 = *(uint *)((long)(((FloatVector *)puVar7)->vector_).arena_or_elements_ + lVar9);
            uVar10 = uVar3 & 0x7fffffff;
            if ((0x7f7fffff < uVar10 || uVar10 - 1 < 0x7fffff && (int)uVar3 < 0) ||
                uVar10 - 0x800000 < 0x7f000000 && (int)uVar3 < 0) {
              local_a0 = (undefined1  [8])local_90;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_a0,
                         "An element of recallvalues is not a positive number or zero.","");
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a0);
              goto LAB_002e60a1;
            }
            lVar9 = lVar9 + 4;
          } while (lVar8 * 4 != lVar9);
        }
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&local_78,index);
        puVar7 = (undefined1 *)pTVar6->recallconfidencethresholds_;
        if ((FloatVector *)puVar7 == (FloatVector *)0x0) {
          puVar7 = Specification::_FloatVector_default_instance_;
        }
        lVar8 = (long)(((FloatVector *)puVar7)->vector_).current_size_;
        if (lVar8 != 0) {
          lVar9 = 0;
          do {
            uVar3 = *(uint *)((long)(((FloatVector *)puVar7)->vector_).arena_or_elements_ + lVar9);
            uVar10 = uVar3 & 0x7fffffff;
            if ((0x7f7fffff < uVar10 || uVar10 - 1 < 0x7fffff && (int)uVar3 < 0) ||
                uVar10 - 0x800000 < 0x7f000000 && (int)uVar3 < 0) {
              local_a0 = (undefined1  [8])local_90;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_a0,
                         "An element of recallconfidencethresholds is not a positive number or zero."
                         ,"");
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a0);
              goto LAB_002e60a1;
            }
            lVar9 = lVar9 + 4;
          } while (lVar8 * 4 != lVar9);
        }
        index = index + 1;
      } while (index != iVar4);
      Result::Result(__return_storage_ptr__);
    }
    google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::
    ~RepeatedPtrField((RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve> *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
  }
  else {
    *(pointer *)__return_storage_ptr__ = local_58;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p == &local_40) {
      paVar1->_M_allocated_capacity = local_40._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_40._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_50._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           local_40._M_allocated_capacity;
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_48;
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_classConfidenceThresholding>(const Specification::Model& format) {
        const auto& interface = format.description();
        Result result;

        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        // validate precisionRecallCurves
        google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve> precisionrecallcurves =
                format.classconfidencethresholding().precisionrecallcurves();
        int nCurves = precisionrecallcurves.size();
        if (nCurves > 0) {
            for (int i = 0; i < nCurves; ++i) {
                int precisionvaluesElts = precisionrecallcurves.Get(i).precisionvalues().vector().size();
                int precisionthreshElts = precisionrecallcurves.Get(i).precisionconfidencethresholds().vector().size();
                if (0 == precisionvaluesElts || precisionvaluesElts != precisionthreshElts) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Zero length or mismatched precisionRecallCurves components");
                }
                
                int recallvaluesElts = precisionrecallcurves.Get(i).recallvalues().vector().size();
                int recallthreshElts = precisionrecallcurves.Get(i).recallconfidencethresholds().vector().size();
                if (0 == recallvaluesElts || recallvaluesElts != recallthreshElts) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Zero length or mismatched precisionRecallCurves components");
                }
                            
                for (auto elt : precisionrecallcurves.Get(i).precisionvalues().vector()) {
                    if (std::isinf(elt) || std::isnan(elt) || elt < 0.0f) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, "An element of precisionvalues is not a positive number or zero.");
                    }
                }
                
                for (auto elt : precisionrecallcurves.Get(i).precisionconfidencethresholds().vector()) {
                    if (std::isinf(elt) || std::isnan(elt) || elt < 0.0f) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, "An element of precisionconfidencethresholds is not a positive number or zero.");
                    }
                }
                
                for (auto elt : precisionrecallcurves.Get(i).recallvalues().vector()) {
                    if (std::isinf(elt) || std::isnan(elt) || elt < 0.0f) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, "An element of recallvalues is not a positive number or zero.");
                    }
                }
                
                for (auto elt : precisionrecallcurves.Get(i).recallconfidencethresholds().vector()) {
                    if (std::isinf(elt) || std::isnan(elt) || elt < 0.0f) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, "An element of recallconfidencethresholds is not a positive number or zero.");
                    }
                }
            }
            return Result();
        } else {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "The ClassConfidenceThresholding model has no precisionRecallCurves.");
        }
    }